

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  HandleTable *this_00;
  uint32_t *puVar2;
  size_t __n;
  LRUHandle *pLVar3;
  uint32_t hash;
  uint uVar4;
  int iVar5;
  uint uVar6;
  LRUHandle *pLVar7;
  LRUHandle **ppLVar8;
  Mutex *__mutex;
  LRUCache *this_01;
  Slice local_40;
  
  hash = Hash(key->data_,key->size_,0);
  uVar4 = hash >> 0x1c;
  __mutex = &this->shard_[uVar4].mutex_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  this_01 = this->shard_ + uVar4;
  __n = key->size_;
  pLVar7 = (LRUHandle *)malloc(__n + 0x47);
  pLVar7->value = value;
  pLVar7->deleter = deleter;
  pLVar7->charge = charge;
  pLVar7->key_length = __n;
  pLVar7->hash = hash;
  pLVar7->in_cache = false;
  pLVar7->refs = 1;
  memcpy(pLVar7->key_data,key->data_,__n);
  if (this_01->capacity_ == 0) {
    pLVar7->next = (LRUHandle *)0x0;
  }
  else {
    pLVar7->refs = 2;
    pLVar7->in_cache = true;
    pLVar7->next = &this->shard_[uVar4].in_use_;
    pLVar3 = this->shard_[uVar4].in_use_.prev;
    pLVar7->prev = pLVar3;
    pLVar3->next = pLVar7;
    pLVar7->next->prev = pLVar7;
    psVar1 = &this->shard_[uVar4].usage_;
    *psVar1 = *psVar1 + charge;
    this_00 = &this->shard_[uVar4].table_;
    local_40.data_ = pLVar7->key_data;
    local_40.size_ = __n;
    ppLVar8 = HandleTable::FindPointer(this_00,&local_40,hash);
    pLVar3 = *ppLVar8;
    if (pLVar3 == (LRUHandle *)0x0) {
      pLVar7->next_hash = (LRUHandle *)0x0;
      *ppLVar8 = pLVar7;
      uVar6 = this->shard_[uVar4].table_.elems_ + 1;
      this->shard_[uVar4].table_.elems_ = uVar6;
      if (this->shard_[uVar4].table_.length_ < uVar6) {
        HandleTable::Resize(this_00);
      }
    }
    else {
      pLVar7->next_hash = pLVar3->next_hash;
      *ppLVar8 = pLVar7;
    }
    LRUCache::FinishErase(this_01,pLVar3);
  }
  if (this_01->capacity_ < this->shard_[uVar4].usage_) {
    do {
      pLVar3 = this->shard_[uVar4].lru_.next;
      if (pLVar3 == &this->shard_[uVar4].lru_) break;
      local_40.data_ = pLVar3->key_data;
      local_40.size_ = pLVar3->key_length;
      ppLVar8 = HandleTable::FindPointer(&this->shard_[uVar4].table_,&local_40,pLVar3->hash);
      pLVar3 = *ppLVar8;
      if (pLVar3 != (LRUHandle *)0x0) {
        *ppLVar8 = pLVar3->next_hash;
        puVar2 = &this->shard_[uVar4].table_.elems_;
        *puVar2 = *puVar2 - 1;
      }
      LRUCache::FinishErase(this_01,pLVar3);
    } while (this_01->capacity_ < this->shard_[uVar4].usage_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (Handle *)pLVar7;
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }